

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodea_io.c
# Opt level: O3

int CVodeSetInitStepB(void *cvode_mem,int which,sunrealtype hinB)

{
  int *piVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  int error_code;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar4 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
    iVar2 = 0x146;
  }
  else if (*(int *)((long)cvode_mem + 0xa78) == 0) {
    msgfmt = "Illegal attempt to call before calling CVodeAdjMalloc.";
    iVar4 = -0x65;
    error_code = -0x65;
    iVar2 = 0x14e;
  }
  else {
    if (which < *(int *)(*(long *)((long)cvode_mem + 0xa70) + 0x38)) {
      piVar3 = (int *)(*(long *)((long)cvode_mem + 0xa70) + 0x30);
      do {
        piVar1 = *(int **)piVar3;
        piVar3 = piVar1 + 0x1e;
      } while (*piVar1 != which);
      iVar2 = CVodeSetInitStep(*(void **)(piVar1 + 4),hinB);
      return iVar2;
    }
    msgfmt = "Illegal value for which.";
    iVar4 = -0x16;
    error_code = -0x16;
    iVar2 = 0x156;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,iVar2,"CVodeSetInitStepB",
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodea_io.c"
                 ,msgfmt);
  return iVar4;
}

Assistant:

int CVodeSetInitStepB(void* cvode_mem, int which, sunrealtype hinB)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVodeBMem cvB_mem;
  void* cvodeB_mem;
  int flag;

  /* Check if cvode_mem exists */
  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Was ASA initialized? */
  if (cv_mem->cv_adjMallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_ADJ, __LINE__, __func__, __FILE__, MSGCV_NO_ADJ);
    return (CV_NO_ADJ);
  }
  ca_mem = cv_mem->cv_adj_mem;

  /* Check which */
  if (which >= ca_mem->ca_nbckpbs)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_WHICH);
    return (CV_ILL_INPUT);
  }

  /* Find the CVodeBMem entry in the linked list corresponding to which */
  cvB_mem = ca_mem->cvB_mem;
  while (cvB_mem != NULL)
  {
    if (which == cvB_mem->cv_index) { break; }
    cvB_mem = cvB_mem->cv_next;
  }

  cvodeB_mem = (void*)(cvB_mem->cv_mem);

  flag = CVodeSetInitStep(cvodeB_mem, hinB);

  return (flag);
}